

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5efc::TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails::
RunImpl(TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails *this)

{
  TestDetails **ppTVar1;
  undefined8 *puVar2;
  int line;
  TestDetails testDetails;
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  RecordingReporter reporter;
  TestDetails local_8a0;
  ScopedCurrentTest local_880;
  TestDetails local_870;
  TestResults local_850;
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  undefined1 local_628;
  undefined4 local_528;
  undefined1 local_524;
  undefined1 local_424;
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628 = 0;
  local_524 = 0;
  local_424 = 0;
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,&local_838);
  UnitTest::TestDetails::TestDetails
            (&local_8a0,"array2DCloseTest","array2DCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&local_880,&local_850,&local_8a0);
  UnitTest::CurrentTest::Results();
  ppTVar1 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar1,0x2c4);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Test throw";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

TEST(CheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		const float data[2][2] = { {0, 1}, {2, 3} };
        CHECK_ARRAY2D_CLOSE (data, ThrowingObject2D(), 2, 2, 0.01f);   line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}